

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::TypeManager::AttachDecorations(TypeManager *this,uint32_t id,Type *type)

{
  pointer pvVar1;
  uint32_t element;
  pointer puVar2;
  int iVar3;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var5;
  pointer __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_1;
  long lVar4;
  
  pvVar1 = (type->decorations_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (type->decorations_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__x);
    CreateDecoration(this,id,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                     false,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  iVar3 = (*type->_vptr_Type[0x1c])(type);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 != 0) {
    for (p_Var5 = *(_Rb_tree_node_base **)(lVar4 + 0x58);
        p_Var5 != (_Rb_tree_node_base *)(lVar4 + 0x48);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::
      pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::pair((pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)&vec,(pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      *)(p_Var5 + 1));
      puVar2 = vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      element = (uint32_t)
                vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (__x_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          __x_00 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)puVar2;
          __x_00 = __x_00 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &vec_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__x_00);
        CreateDecoration(this,id,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &vec_1.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                         true,element);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&vec_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void TypeManager::AttachDecorations(uint32_t id, const Type* type) {
  for (auto vec : type->decorations()) {
    CreateDecoration(id, vec);
  }
  if (const Struct* structTy = type->AsStruct()) {
    for (auto pair : structTy->element_decorations()) {
      uint32_t element = pair.first;
      for (auto vec : pair.second) {
        CreateDecoration(id, vec, /* is_member */ true, element);
      }
    }
  }
}